

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

void __thiscall EventDispatcherHelper::lookupListeners(EventDispatcherHelper *this,Event *ev)

{
  EventListenerNode *pEVar1;
  IEventListener *pIVar2;
  iterator iVar3;
  iterator iVar4;
  iterator i;
  iterator local_30;
  
  i.mNode = ((this->mEventList).mHead)->next;
  iVar4.mNode = i.mNode;
LAB_00117362:
  if (iVar4.mNode == (this->mEventList).mTail) {
    return;
  }
  pEVar1 = (iVar4.mNode)->val;
  pIVar2 = pEVar1->mListener;
  if (pIVar2 == (IEventListener *)0x0) goto LAB_00117391;
  if ((pEVar1->mEventId == -1) ||
     (iVar3.mNode = iVar4.mNode, pEVar1->mEventId == *(int *)&(ev->super_RefCount).field_0xc)) {
    (*(code *)**(undefined8 **)pIVar2)(pIVar2,ev);
    goto LAB_001173bd;
  }
  goto LAB_001173c7;
LAB_00117391:
  operator_delete(pEVar1,0x10);
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::erase(&local_30);
  i.mNode = local_30.mNode;
  iVar4.mNode = local_30.mNode;
  if (local_30.mNode != (Node *)0x0) {
    i.mNode = (local_30.mNode)->prev;
LAB_001173bd:
    iVar3.mNode = i.mNode;
    iVar4.mNode = (Node *)0x0;
    if (i.mNode != (Node *)0x0) {
LAB_001173c7:
      i.mNode = (iVar3.mNode)->next;
      iVar4.mNode = i.mNode;
    }
  }
  goto LAB_00117362;
}

Assistant:

void EventDispatcherHelper::lookupListeners( Event *ev )
{
	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		// Prune dead listener nodes
		if ( (*i)->mListener == NULL )
		{
			delete *i;
			i = i.erase();
			--i;
		}
		else if ( (*i)->mEventId == ev->getEventId() || 
				  (*i)->mEventId == Event::kInvalidEventId )
		{
			IEventListener *listener = (*i)->mListener;
			listener->receiveEvent( ev );
		}
	}	
}